

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O0

float gimage::expandGaussPixel<unsigned_char>
                (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long i,long k,
                int j)

{
  work_t wVar1;
  work_t wVar2;
  work_t wVar3;
  work_t wVar4;
  work_t wVar5;
  work_t wVar6;
  work_t wVar7;
  ulong in_RDX;
  ulong in_RSI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long kk_3;
  long ii_3;
  long kk_2;
  long ii_2;
  long kk_1;
  long ii_1;
  long kk;
  long ii;
  float ret;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  float fVar12;
  undefined4 in_stack_ffffffffffffff4c;
  float fVar13;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  float fVar14;
  undefined4 local_20;
  
  if ((in_RSI & 1) == 0) {
    if ((in_RDX & 1) == 0) {
      wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      fVar8 = (float)wVar7;
      wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(int)fVar8);
      fVar9 = fVar8 * 0.0039062 + (float)wVar7 * 0.0234375;
      fVar10 = 0.0039062;
      wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         CONCAT44(fVar9,0.0039062),(int)fVar8);
      local_20 = fVar10 * (float)wVar7 + fVar9 +
                 (float)wVar6 * 0.0234375 + (float)wVar4 * 0.0234375 + (float)wVar5 * 0.140625 +
                 (float)wVar3 * 0.0039062 + (float)wVar1 * 0.0039062 + (float)wVar2 * 0.0234375;
    }
    else {
      fVar13 = 0.015625;
      wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         CONCAT44(0.015625,in_stack_ffffffffffffff48),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      fVar8 = (float)wVar1;
      fVar12 = 0.09375;
      wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff54,fVar8),CONCAT44(fVar13,0.09375),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      fVar11 = fVar12 * (float)wVar1;
      fVar9 = fVar13 * fVar8;
      fVar14 = 0.015625;
      wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(0.015625,fVar8),CONCAT44(fVar13,fVar12),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      fVar10 = fVar14 * (float)wVar1;
      wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(fVar14,fVar8),CONCAT44(fVar13,fVar12),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(fVar14,fVar8),CONCAT44(fVar13,fVar12),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(fVar14,fVar8),CONCAT44(fVar13,fVar12),
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      local_20 = (float)wVar3 * 0.015625 + (float)wVar1 * 0.015625 + (float)wVar2 * 0.09375 +
                 fVar10 + fVar9 + fVar11;
    }
    local_20 = local_20 * 4.0;
  }
  else if ((in_RDX & 1) == 0) {
    wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    local_20 = ((float)wVar5 * 0.015625 + (float)wVar6 * 0.015625 +
               (float)wVar3 * 0.09375 + (float)wVar4 * 0.09375 +
               (float)wVar1 * 0.015625 + (float)wVar2 * 0.015625) * 4.0;
  }
  else {
    wVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
    local_20 = (float)((wVar1 + wVar2 + wVar3 + wVar4) / 4);
  }
  return local_20;
}

Assistant:

float expandGaussPixel(const Image<T> &image, long i, long k, int j)
{
  static const float g[5][5]=
  {
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0234375f, 0.0937500f, 0.1406250f, 0.0937500f, 0.0234375f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
  };

  float ret;

  if (i&0x1)
  {
    if (k&0x1)
    {
      long ii=i>>1;
      long kk=k>>1;

      ret=static_cast<float>((image.getBounds(ii, kk, j)+image.getBounds(ii+1, kk, j)+
                             image.getBounds(ii, kk+1, j)+image.getBounds(ii+1, kk+1, j))/4);
    }
    else
    {
      long ii=i>>1;
      long kk=(k>>1)-1;

      ret =g[0][1]*image.getBounds(ii, kk, j)+g[0][3]*image.getBounds(ii+1, kk, j);
      ret+=g[2][1]*image.getBounds(ii, kk+1, j)+g[2][3]*image.getBounds(ii+1, kk+1, j);
      ret+=g[4][1]*image.getBounds(ii, kk+2, j)+g[4][3]*image.getBounds(ii+1, kk+2, j);
      ret*=4;
    }
  }
  else
  {
    if (k&0x1)
    {
      long ii=(i>>1)-1;
      long kk=k>>1;

      ret =g[1][0]*image.getBounds(ii, kk, j)+g[1][2]*image.getBounds(ii+1, kk, j)+g[1][4]*image.getBounds(ii+2, kk, j);
      ret+=g[3][0]*image.getBounds(ii, kk+1, j)+g[3][2]*image.getBounds(ii+1, kk+1, j)+g[3][4]*image.getBounds(ii+2, kk+1, j);
      ret*=4;
    }
    else
    {
      long ii=(i>>1)-1;
      long kk=(k>>1)-1;

      ret =g[0][0]*image.getBounds(ii, kk, j)+g[0][2]*image.getBounds(ii+1, kk, j)+g[0][4]*image.getBounds(ii+2, kk, j);
      ret+=g[2][0]*image.getBounds(ii, kk+1, j)+g[2][2]*image.getBounds(ii+1, kk+1, j)+g[2][4]*image.getBounds(ii+2, kk+1, j);
      ret+=g[4][0]*image.getBounds(ii, kk+2, j)+g[4][2]*image.getBounds(ii+1, kk+2, j)+g[4][4]*image.getBounds(ii+2, kk+2, j);
      ret*=4;
    }
  }

  return ret;
}